

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDsd.c
# Opt level: O2

int Ivy_TruthDecompose_rec(uint uTruth,Vec_Int_t *vTree)

{
  uint Var;
  Vec_Int_t *pVVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  int *piVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  Ivy_Dec_t local_c8;
  uint local_c4;
  undefined8 local_c0;
  Vec_Int_t *local_b8;
  ulong local_b0;
  int Supp [5];
  int Vars0 [5];
  int Vars1 [5];
  int Vars2 [5];
  
  iVar14 = 0;
  local_c4 = 0;
  uVar3 = 0;
  uVar2 = 0;
  local_b0 = local_b0 & 0xffffffff00000000;
  local_b8 = vTree;
  for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
    uVar6 = s_Masks[lVar7][0] & uTruth;
    if (uVar6 == 0) {
      Vars0[(int)uVar3] = iVar14;
      uVar3 = uVar3 + 1;
    }
    else {
      uVar12 = s_Masks[lVar7][1] & uTruth;
      if (uVar12 == 0) {
        Vars0[(int)uVar3] = iVar14 + 1;
        uVar3 = uVar3 + 1;
      }
      else if (uVar6 == s_Masks[lVar7][0]) {
        Vars1[(int)uVar2] = iVar14;
        uVar2 = uVar2 + 1;
      }
      else if (uVar12 == s_Masks[lVar7][1]) {
        Vars1[(int)uVar2] = iVar14 + 1;
        uVar2 = uVar2 + 1;
      }
      else {
        local_c0 = CONCAT44(local_c0._4_4_,uVar2);
        uVar2 = Ivy_TruthCofactor(uTruth,iVar14 + 1);
        uVar6 = Ivy_TruthCofactor(uTruth,iVar14);
        if ((uVar6 ^ uVar2) == 0xffffffff) {
          lVar5 = (long)(int)(uint)local_b0;
          local_b0 = CONCAT44(local_b0._4_4_,(uint)local_b0 + 1);
          Vars2[lVar5] = iVar14;
        }
        else if (uVar2 != uVar6) {
          lVar5 = (long)(int)local_c4;
          local_c4 = local_c4 + 1;
          Supp[lVar5] = (int)lVar7;
        }
        uVar2 = (uint)local_c0;
      }
    }
    iVar14 = iVar14 + 2;
  }
  if (uVar2 != 0 && uVar3 != 0) {
    __assert_fail("Count0 == 0 || Count1 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDsd.c"
                  ,0xf8,"int Ivy_TruthDecompose_rec(unsigned int, Vec_Int_t *)");
  }
  if ((uint)local_b0 != 0 && uVar3 != 0) {
    __assert_fail("Count0 == 0 || Count2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDsd.c"
                  ,0xf9,"int Ivy_TruthDecompose_rec(unsigned int, Vec_Int_t *)");
  }
  if (uVar2 != 0 && (uint)local_b0 != 0) {
    __assert_fail("Count1 == 0 || Count2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDsd.c"
                  ,0xfa,"int Ivy_TruthDecompose_rec(unsigned int, Vec_Int_t *)");
  }
  if (uVar3 != 1 || local_c4 != 0) {
    if ((uVar3 == 0 && uVar2 == 0) && (uint)local_b0 == 0) {
      if ((int)local_c4 < 3) {
        __assert_fail("nSupp >= 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDsd.c"
                      ,0x145,"int Ivy_TruthRecognizeMuxMaj(unsigned int, int *, int, Vec_Int_t *)");
      }
      uVar13 = (ulong)local_c4;
      uVar8 = 0;
LAB_0064f2cd:
      if (uVar8 == uVar13) {
LAB_0064f3ab:
        if (local_c4 != 3) {
          return -1;
        }
        uVar2 = (uTruth >> 1 & 0x55555555) + (uTruth & 0x55555555);
        uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333);
        uVar2 = (uVar2 >> 4 & 0x7070707) + (uVar2 & 0x7070707);
        uVar2 = (uVar2 >> 8 & 0xf000f) + (uVar2 & 0xf000f);
        if ((uVar2 >> 0x10) + (uVar2 & 0xffff) != 0x10) {
          return -1;
        }
        local_c8 = (Ivy_Dec_t)((uint)local_c8 & 0xff000000);
        for (uVar2 = 0; uVar2 != 8; uVar2 = uVar2 + 1) {
          uVar3 = 0;
          for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
            if ((uVar2 >> ((uint)lVar7 & 0x1f) & 1) != 0) {
              uVar3 = uVar3 | 1 << (*(byte *)(Supp + lVar7) & 0x1f);
            }
          }
          if (0x1f < uVar3) {
            __assert_fail("Num < 32",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDsd.c"
                          ,0x177,
                          "int Ivy_TruthRecognizeMuxMaj(unsigned int, int *, int, Vec_Int_t *)");
          }
          if ((uTruth >> (uVar3 & 0x1f) & 1) != 0) {
            for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
              if ((uVar2 >> ((uint)lVar7 & 0x1f) & 1) != 0) {
                (&local_c8.field_0x0)[lVar7] = (&local_c8.field_0x0)[lVar7] + '\x01';
              }
            }
          }
        }
        if (((uint)local_c8 & 0xff | 2) != 3) {
          __assert_fail("Count[0] == 1 || Count[0] == 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDsd.c"
                        ,0x17e,"int Ivy_TruthRecognizeMuxMaj(unsigned int, int *, int, Vec_Int_t *)"
                       );
        }
        if ((local_c8._1_1_ & 0xfd) != 1) {
          __assert_fail("Count[1] == 1 || Count[1] == 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDsd.c"
                        ,0x17f,"int Ivy_TruthRecognizeMuxMaj(unsigned int, int *, int, Vec_Int_t *)"
                       );
        }
        if ((local_c8._2_1_ & 0xfd) != 1) {
          __assert_fail("Count[2] == 1 || Count[2] == 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDsd.c"
                        ,0x180,"int Ivy_TruthRecognizeMuxMaj(unsigned int, int *, int, Vec_Int_t *)"
                       );
        }
        uVar2 = (uint)(local_c8._0_1_ == '\x01') << 8 | (uint)(local_c8._1_1_ == 1) << 0xc |
                (uint)(local_c8._2_1_ == 1) << 0x10 | (Supp[0] & 7U) << 9 | (Supp[1] & 7U) << 0xd |
                (Supp[2] & 7U) << 0x11 | 0x66;
LAB_0064f50f:
        pVVar1 = local_b8;
        Vec_IntPush(local_b8,uVar2);
        return pVVar1->nSize * 2 + -2;
      }
      uVar2 = Supp[uVar8];
      local_b0 = (ulong)uVar2;
      uVar3 = Ivy_TruthCofactor(uTruth,uVar2 * 2 + 1);
      uVar2 = Ivy_TruthCofactor(uTruth,uVar2 * 2);
      local_c0 = CONCAT44(local_c0._4_4_,uVar2);
      uVar11 = 0;
      do {
        if (uVar13 == uVar11) {
          uVar2 = Ivy_TruthDecompose_rec(uVar3,local_b8);
          if (uVar2 == 0xffffffff) goto LAB_0064f3ab;
          uVar3 = Ivy_TruthDecompose_rec((uint)local_c0,local_b8);
          if (uVar3 == 0xffffffff) goto LAB_0064f3ab;
          uVar2 = (uVar3 & 0xf) * 0x1000 + ((uVar2 & 0xf) << 0x10 | ((uint)local_b0 & 7) << 9) +
                  0x65;
          goto LAB_0064f50f;
        }
        if (uVar8 != uVar11) {
          iVar14 = Supp[uVar11];
          iVar4 = Ivy_TruthDepends(uVar3,iVar14);
          if (iVar4 != 0) {
            iVar14 = Ivy_TruthDepends((uint)local_c0,iVar14);
            if (iVar14 != 0) goto LAB_0064f337;
          }
        }
        uVar11 = uVar11 + 1;
      } while( true );
    }
    uVar6 = 3;
    if ((int)uVar3 < 1) {
      if ((int)uVar2 < 1) {
        if ((int)(uint)local_b0 < 1) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDsd.c"
                        ,0x10d,"int Ivy_TruthDecompose_rec(unsigned int, Vec_Int_t *)");
        }
        local_c0 = 0;
        piVar9 = Vars2;
        uVar6 = 4;
        uVar2 = (uint)local_b0;
      }
      else {
        uTruth = ~uTruth;
        local_c0 = 1;
        piVar9 = Vars1;
      }
    }
    else {
      local_c0 = 0;
      piVar9 = Vars0;
      uVar2 = uVar3;
    }
    local_c8 = (Ivy_Dec_t)(((0 < (int)local_c4) + uVar2 & 7) << 5 | uVar6);
    for (uVar8 = 0; uVar2 != uVar8; uVar8 = uVar8 + 1) {
      uVar3 = piVar9[uVar8];
      uTruth = Ivy_TruthCofactor(uTruth,uVar3);
      Ivy_DecSetVar(&local_c8,(int)uVar8,uVar3);
    }
    uVar10 = (uint)local_c8 & 0xf;
    uVar12 = (uint)local_c0;
    uVar6 = (uint)local_c8 >> 5 & 1 ^ uVar12 ^ 1;
    uVar3 = uVar12;
    if (uVar10 == 4) {
      uVar3 = uVar6;
    }
    if ((int)local_c4 < 1) {
      if (uVar10 == 4) {
        uVar12 = uVar6 ^ uTruth == 0;
      }
    }
    else {
      if (uTruth + 1 < 2) {
        __assert_fail("uTruthCof != 0 && ~uTruthCof != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDsd.c"
                      ,0x11d,"int Ivy_TruthDecompose_rec(unsigned int, Vec_Int_t *)");
      }
      uVar6 = Ivy_TruthDecompose_rec(uTruth,local_b8);
      if (uVar6 == 0xffffffff) {
        return -1;
      }
      Var = uVar6 & 0xfffffffe;
      if (uVar10 != 4) {
        Var = uVar6;
      }
      uVar12 = uVar3 ^ (byte)uVar6 & uVar10 == 4;
      Ivy_DecSetVar(&local_c8,uVar2,Var);
    }
    pVVar1 = local_b8;
    Vec_IntPush(local_b8,(int)local_c8);
    Vars0[0] = uVar12 + pVVar1->nSize * 2 + -2;
  }
  return Vars0[0];
LAB_0064f337:
  uVar8 = uVar8 + 1;
  goto LAB_0064f2cd;
}

Assistant:

int Ivy_TruthDecompose_rec( unsigned uTruth, Vec_Int_t * vTree )
{
    Ivy_Dec_t Node;
    int Supp[5], Vars0[5], Vars1[5], Vars2[5], * pVars = NULL;
    int nSupp, Count0, Count1, Count2, nVars = 0, RetValue, fCompl = 0, i;
    unsigned uTruthCof, uCof0, uCof1;

    // get constant confactors
    Count0 = Count1 = Count2 = nSupp = 0;
    for ( i = 0; i < 5; i++ )
    {
        if ( Ivy_TruthCofactorIsConst(uTruth, i, 0, 0) )
            Vars0[Count0++] = (i << 1) | 0;
        else if ( Ivy_TruthCofactorIsConst(uTruth, i, 1, 0) )
            Vars0[Count0++] = (i << 1) | 1;
        else if ( Ivy_TruthCofactorIsConst(uTruth, i, 0, 1) )
            Vars1[Count1++] = (i << 1) | 0;
        else if ( Ivy_TruthCofactorIsConst(uTruth, i, 1, 1) )
            Vars1[Count1++] = (i << 1) | 1;
        else
        {
            uCof0 = Ivy_TruthCofactor( uTruth, (i << 1) | 1 );
            uCof1 = Ivy_TruthCofactor( uTruth, (i << 1) | 0 );
            if ( uCof0 == ~uCof1 )
                Vars2[Count2++] = (i << 1) | 0;
            else if ( uCof0 != uCof1 )
                Supp[nSupp++] = i;
        }
    }
    assert( Count0 == 0 || Count1 == 0 );
    assert( Count0 == 0 || Count2 == 0 );
    assert( Count1 == 0 || Count2 == 0 );

    // consider the case of a single variable
    if ( Count0 == 1 && nSupp == 0 )
        return Vars0[0];

    // consider more complex decompositions
    if ( Count0 == 0 && Count1 == 0 && Count2 == 0 )
        return Ivy_TruthRecognizeMuxMaj( uTruth, Supp, nSupp, vTree );

    // extract the nodes
    Ivy_DecClear( &Node );
    if ( Count0 > 0 )
        nVars = Count0, pVars = Vars0, Node.Type = IVY_DEC_AND,  fCompl = 0;
    else if ( Count1 > 0 )
        nVars = Count1, pVars = Vars1, Node.Type = IVY_DEC_AND,  fCompl = 1, uTruth = ~uTruth;
    else if ( Count2 > 0 )
        nVars = Count2, pVars = Vars2, Node.Type = IVY_DEC_EXOR, fCompl = 0;
    else 
        assert( 0 );
    Node.nFans = nVars+(nSupp>0);

    // compute cofactor
    uTruthCof = uTruth;
    for ( i = 0; i < nVars; i++ )
    {
        uTruthCof = Ivy_TruthCofactor( uTruthCof, pVars[i] );
        Ivy_DecSetVar( &Node, i, pVars[i] );
    }

    if ( Node.Type == IVY_DEC_EXOR )
        fCompl ^= ((Node.nFans & 1) == 0);

    if ( nSupp > 0 )
    {
        assert( uTruthCof != 0 && ~uTruthCof != 0 );
        // call recursively
        RetValue = Ivy_TruthDecompose_rec( uTruthCof, vTree );
        // quit if non-decomposable
        if ( RetValue == -1 )
            return -1;
        // remove the complement from the child if the node is EXOR
        if ( Node.Type == IVY_DEC_EXOR && (RetValue & 1) )
        {
            fCompl ^= 1;
            RetValue ^= 1;
        }
        // set the new decomposition
        Ivy_DecSetVar( &Node, nVars, RetValue );
    }
    else if ( Node.Type == IVY_DEC_EXOR )
        fCompl ^= (uTruthCof == 0);

    Vec_IntPush( vTree, Ivy_DecToInt(Node) );
    return ((Vec_IntSize(vTree)-1) << 1) | fCompl;
}